

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void test<long>(bool shouldBeValid,string *value)

{
  char cVar1;
  size_type sVar2;
  uint uVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  size_type sVar8;
  byte bVar9;
  char *pcVar10;
  uint uVar11;
  ulong uVar12;
  bool shouldBeValid_local;
  AssertHelper local_70;
  AssertionResult gtest_ar_1;
  bool valid;
  AssertionResult gtest_ar;
  undefined1 local_40 [16];
  
  sVar2 = value->_M_string_length;
  if (sVar2 == 0) {
LAB_0011d4e1:
    valid = false;
    uVar12 = 0;
  }
  else {
    pcVar5 = (value->_M_dataplus)._M_p;
    pcVar10 = pcVar5 + sVar2;
    if (*pcVar5 == '-') {
      if (sVar2 == 1) goto LAB_0011d4e1;
      uVar7 = 0xf333333333333334;
      pcVar5 = pcVar5 + 1;
      uVar12 = 0;
      do {
        if ((byte)(*pcVar5 - 0x3aU) < 0xf6) goto LAB_0011d3cf;
        bVar9 = *pcVar5 - 0x30;
        if ((long)uVar12 < -0xccccccccccccccc) goto LAB_0011d3cf;
        if (uVar12 == 0xf333333333333334 && 8 < bVar9) goto LAB_0011d4d7;
        uVar12 = uVar12 * 10 - (ulong)bVar9;
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 < pcVar10);
    }
    else {
      if (*pcVar5 == '+') {
        pcVar5 = pcVar5 + 1;
      }
      if (pcVar5 == pcVar10) goto LAB_0011d4e1;
      uVar7 = 0xccccccccccccccc;
      uVar12 = 0;
      do {
        if ((byte)(*pcVar5 - 0x3aU) < 0xf6) goto LAB_0011d3cf;
        bVar9 = *pcVar5 - 0x30;
        if (0xccccccccccccccc < (long)uVar12) goto LAB_0011d3cf;
        if (uVar12 == 0xccccccccccccccc && 7 < bVar9) goto LAB_0011d4d7;
        uVar12 = (ulong)bVar9 + uVar12 * 10;
        pcVar5 = pcVar5 + 1;
      } while (pcVar5 < pcVar10);
    }
    valid = true;
  }
  goto LAB_0011d0c2;
LAB_0011d3cf:
  valid = false;
  goto LAB_0011d0c2;
LAB_0011d4d7:
  valid = false;
  uVar12 = uVar7;
LAB_0011d0c2:
  shouldBeValid_local = shouldBeValid;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"shouldBeValid","valid",&shouldBeValid_local,&valid);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_1);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xc,pcVar10);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar_1);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (((CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != 0) &&
        (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if (shouldBeValid_local != true) {
    return;
  }
  uVar7 = -uVar12;
  if (0 < (long)uVar12) {
    uVar7 = uVar12;
  }
  if (uVar7 < 10) {
    uVar11 = 1;
  }
  else {
    uVar6 = uVar7;
    uVar3 = 4;
    do {
      uVar11 = uVar3;
      if (uVar6 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_0011d1fe;
      }
      if (uVar6 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_0011d1fe;
      }
      if (uVar6 < 10000) goto LAB_0011d1fe;
      bVar4 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = uVar11 + 4;
    } while (bVar4);
    uVar11 = uVar11 + 1;
  }
LAB_0011d1fe:
  gtest_ar._0_8_ = local_40;
  std::__cxx11::string::_M_construct((ulong)&gtest_ar,(char)uVar11 - (char)((long)uVar12 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)(gtest_ar._0_8_ - ((long)uVar12 >> 0x3f)),uVar11,uVar7);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"value","std::to_string(result)",value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  if ((undefined1 *)gtest_ar._0_8_ != local_40) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0xe,pcVar10);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (((gtest_ar._0_8_ != 0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_1.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    return;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar_1.message_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  sVar2 = value->_M_string_length;
  if (sVar2 != 0) {
    pcVar10 = (value->_M_dataplus)._M_p;
    if (*pcVar10 == '-') {
      if (sVar2 != 1) {
        sVar8 = 1;
        uVar12 = 0;
        do {
          uVar12 = (uVar12 * 10 - (long)pcVar10[sVar8]) + 0x30;
          sVar8 = sVar8 + 1;
        } while (sVar2 != sVar8);
        goto LAB_0011d2fc;
      }
    }
    else {
      pcVar5 = pcVar10 + sVar2;
      if (*pcVar10 == '+') {
        pcVar10 = pcVar10 + 1;
      }
      if (pcVar10 != pcVar5) {
        uVar12 = 0;
        do {
          cVar1 = *pcVar10;
          pcVar10 = pcVar10 + 1;
          uVar12 = (uVar12 * 10 + (long)cVar1) - 0x30;
        } while (pcVar10 != pcVar5);
        goto LAB_0011d2fc;
      }
    }
  }
  uVar12 = 0;
LAB_0011d2fc:
  uVar7 = -uVar12;
  if (0 < (long)uVar12) {
    uVar7 = uVar12;
  }
  if (uVar7 < 10) {
    uVar11 = 1;
  }
  else {
    uVar6 = uVar7;
    uVar3 = 4;
    do {
      uVar11 = uVar3;
      if (uVar6 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_0011d3df;
      }
      if (uVar6 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_0011d3df;
      }
      if (uVar6 < 10000) goto LAB_0011d3df;
      bVar4 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = uVar11 + 4;
    } while (bVar4);
    uVar11 = uVar11 + 1;
  }
LAB_0011d3df:
  gtest_ar._0_8_ = local_40;
  std::__cxx11::string::_M_construct((ulong)&gtest_ar,(char)uVar11 - (char)((long)uVar12 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)(gtest_ar._0_8_ - ((long)uVar12 >> 0x3f)),uVar11,uVar7);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_1,"value","std::to_string(result2)",value,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar);
  if ((undefined1 *)gtest_ar._0_8_ != local_40) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jsteemann[P]atoi/tests/tests.cpp",
               0x10,pcVar10);
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if (((gtest_ar._0_8_ != 0) && (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
       (gtest_ar._0_8_ != 0)) {
      (**(code **)(*(long *)gtest_ar._0_8_ + 8))();
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_1.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar_1.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  return;
}

Assistant:

static void test(bool shouldBeValid, std::string const& value) {
  bool valid;
  T result = jsteemann::atoi<T>(value.c_str(), value.c_str() + value.size(), valid);
  ASSERT_EQ(shouldBeValid, valid);
  if (shouldBeValid) {
    ASSERT_EQ(value, std::to_string(result));
    T result2 = jsteemann::atoi_unchecked<T>(value.c_str(), value.c_str() + value.size());
    ASSERT_EQ(value, std::to_string(result2));
  }
}